

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void RestoreModel(CPpmd8 *p,CTX_PTR c1)

{
  uint uVar1;
  byte bVar2;
  ushort uVar3;
  UInt32 UVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  CPpmd_Void_Ref *pCVar9;
  Byte *pBVar10;
  CPpmd8_Context *pCVar11;
  int local_c8 [40];
  
  pCVar11 = p->MaxContext;
  pBVar10 = p->Base;
  p->Text = pBVar10 + p->AlignOffset;
  for (; pCVar11 != c1; pCVar11 = (CPpmd8_Context *)(pBVar10 + pCVar11->Suffix)) {
    bVar2 = pCVar11->NumStats - 1;
    pCVar11->NumStats = bVar2;
    if (bVar2 == 0) {
      uVar5 = (ulong)pCVar11->Stats;
      pCVar11->Flags = (0x3f < pBVar10[uVar5]) << 3 | pCVar11->Flags & 0x10;
      *(undefined4 *)&pCVar11->SummFreq = *(undefined4 *)(pBVar10 + uVar5);
      *(undefined2 *)((long)&pCVar11->Stats + 2) = *(undefined2 *)(pBVar10 + uVar5 + 4);
      SpecialFreeUnit(p,pBVar10 + uVar5);
      *(char *)((long)&pCVar11->SummFreq + 1) =
           (char)(*(byte *)((long)&pCVar11->SummFreq + 1) + 0xb >> 3);
    }
    else {
      Refresh(p,pCVar11,bVar2 + 3 >> 1,0);
    }
    pBVar10 = p->Base;
  }
  for (; pCVar11 != p->MinContext; pCVar11 = (CPpmd8_Context *)(pBVar10 + pCVar11->Suffix)) {
    bVar2 = pCVar11->NumStats;
    if (bVar2 == 0) {
      bVar2 = *(byte *)((long)&pCVar11->SummFreq + 1);
      *(byte *)((long)&pCVar11->SummFreq + 1) = bVar2 - (bVar2 >> 1);
    }
    else {
      uVar3 = pCVar11->SummFreq + 4;
      pCVar11->SummFreq = uVar3;
      if ((ushort)((ushort)bVar2 * 4 + 0x80) < uVar3) {
        Refresh(p,pCVar11,bVar2 + 2 >> 1,1);
        pBVar10 = p->Base;
      }
    }
  }
  if ((p->RestoreMethod == 0) || (UVar4 = GetUsedMemory(p), UVar4 < p->Size >> 1)) {
    RestartModel(p);
    return;
  }
  pCVar11 = p->MaxContext;
  while ((ulong)pCVar11->Suffix != 0) {
    pCVar11 = (CPpmd8_Context *)(pBVar10 + pCVar11->Suffix);
    p->MaxContext = pCVar11;
  }
  do {
    CutOff(p,p->MaxContext,0);
    memset(local_c8,0,0x98);
    pBVar10 = p->LoUnit;
    if (pBVar10 != p->HiUnit) {
      pBVar10[0] = '\0';
      pBVar10[1] = '\0';
      pBVar10[2] = '\0';
      pBVar10[3] = '\0';
    }
    for (piVar8 = (int *)p->UnitsStart; *piVar8 == -1; piVar8 = piVar8 + (ulong)uVar1 * 3) {
      *piVar8 = 0;
      uVar1 = piVar8[2];
      local_c8[p->Units2Indx[uVar1 - 1]] = local_c8[p->Units2Indx[uVar1 - 1]] + 1;
    }
    p->UnitsStart = (Byte *)piVar8;
    for (lVar6 = 0; lVar6 != 0x26; lVar6 = lVar6 + 1) {
      pCVar9 = p->FreeList + lVar6;
      iVar7 = local_c8[lVar6];
      while (iVar7 != 0) {
        pBVar10 = p->Base;
        piVar8 = (int *)(pBVar10 + *pCVar9);
        do {
          if (*piVar8 != 0) goto LAB_0017ddba;
          uVar1 = piVar8[1];
          *pCVar9 = uVar1;
          p->Stamps[lVar6] = p->Stamps[lVar6] - 1;
          piVar8 = (int *)(pBVar10 + uVar1);
          iVar7 = local_c8[lVar6] + -1;
          local_c8[lVar6] = iVar7;
        } while (iVar7 != 0);
        iVar7 = 0;
LAB_0017ddba:
        pCVar9 = (CPpmd_Void_Ref *)(piVar8 + 1);
      }
    }
    UVar4 = GetUsedMemory(p);
    if (UVar4 <= (p->Size >> 2) * 3) {
      p->GlueCount = 0;
      p->OrderFall = p->MaxOrder;
      return;
    }
  } while( true );
}

Assistant:

static void RestoreModel(CPpmd8 *p, CTX_PTR c1
    #ifdef PPMD8_FREEZE_SUPPORT
    , CTX_PTR fSuccessor
    #endif
    )
{
  CTX_PTR c;
  CPpmd_State *s;
  RESET_TEXT(0);
  for (c = p->MaxContext; c != c1; c = SUFFIX(c))
    if (--(c->NumStats) == 0)
    {
      s = STATS(c);
      c->Flags = (Byte)((c->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(c) = *s;
      SpecialFreeUnit(p, s);
      ONE_STATE(c)->Freq = (Byte)(((unsigned)ONE_STATE(c)->Freq + 11) >> 3);
    }
    else
      Refresh(p, c, (c->NumStats+3) >> 1, 0);
 
  for (; c != p->MinContext; c = SUFFIX(c))
    if (!c->NumStats)
      ONE_STATE(c)->Freq = (Byte)(ONE_STATE(c)->Freq - (ONE_STATE(c)->Freq >> 1));
    else if ((c->SummFreq += 4) > 128 + 4 * c->NumStats)
      Refresh(p, c, (c->NumStats + 2) >> 1, 1);

  #ifdef PPMD8_FREEZE_SUPPORT
  if (p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE)
  {
    p->MaxContext = fSuccessor;
    p->GlueCount += !(p->Stamps[1] & 1);
  }
  else if (p->RestoreMethod == PPMD8_RESTORE_METHOD_FREEZE)
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    RemoveBinContexts(p, p->MaxContext, 0);
    p->RestoreMethod++;
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
  else
  #endif
  if (p->RestoreMethod == PPMD8_RESTORE_METHOD_RESTART || GetUsedMemory(p) < (p->Size >> 1))
    RestartModel(p);
  else
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    do
    {
      CutOff(p, p->MaxContext, 0);
      ExpandTextArea(p);
    }
    while (GetUsedMemory(p) > 3 * (p->Size >> 2));
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
}